

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O1

void __thiscall
FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor>::FileInfoWrapper
          (FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor> *this,
          IFileReaderFactory *fileReaderFactory)

{
  list<ASDCP::MXF::ACESPictureSubDescriptor_*,_std::allocator<ASDCP::MXF::ACESPictureSubDescriptor_*>_>
  *plVar1;
  list<ASDCP::MXF::TargetFrameSubDescriptor_*,_std::allocator<ASDCP::MXF::TargetFrameSubDescriptor_*>_>
  *plVar2;
  UL *pUVar3;
  
  this->_vptr_FileInfoWrapper = (_func_int **)&PTR__FileInfoWrapper_00113bc8;
  AS_02::ACES::MXFReader::MXFReader(&this->m_Reader,fileReaderFactory);
  (this->m_Desc).super_PictureDescriptor.EditRate.Numerator = 0;
  (this->m_Desc).super_PictureDescriptor.EditRate.Denominator = 0;
  (this->m_Desc).super_PictureDescriptor.SampleRate.Numerator = 0;
  (this->m_Desc).super_PictureDescriptor.SampleRate.Denominator = 0;
  plVar1 = &(this->m_Desc).m_ACESPictureSubDescriptorList;
  (this->m_Desc).super_PictureDescriptor.Channels.
  super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Desc).super_PictureDescriptor.Channels.
  super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Desc).super_PictureDescriptor.Channels.
  super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_Desc).super_PictureDescriptor.Other.
  super__Vector_base<AS_02::ACES::generic,_std::allocator<AS_02::ACES::generic>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Desc).super_PictureDescriptor.Other.
  super__Vector_base<AS_02::ACES::generic,_std::allocator<AS_02::ACES::generic>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Desc).super_PictureDescriptor.Other.
  super__Vector_base<AS_02::ACES::generic,_std::allocator<AS_02::ACES::generic>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_Desc).m_RGBADescriptor = (RGBAEssenceDescriptor *)0x0;
  (this->m_Desc).m_ACESPictureSubDescriptorList.
  super__List_base<ASDCP::MXF::ACESPictureSubDescriptor_*,_std::allocator<ASDCP::MXF::ACESPictureSubDescriptor_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->m_Desc).m_ACESPictureSubDescriptorList.
  super__List_base<ASDCP::MXF::ACESPictureSubDescriptor_*,_std::allocator<ASDCP::MXF::ACESPictureSubDescriptor_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->m_Desc).m_ACESPictureSubDescriptorList.
  super__List_base<ASDCP::MXF::ACESPictureSubDescriptor_*,_std::allocator<ASDCP::MXF::ACESPictureSubDescriptor_*>_>
  ._M_impl._M_node._M_size = 0;
  plVar2 = &(this->m_Desc).m_TargetFrameSubDescriptorList;
  (this->m_Desc).m_TargetFrameSubDescriptorList.
  super__List_base<ASDCP::MXF::TargetFrameSubDescriptor_*,_std::allocator<ASDCP::MXF::TargetFrameSubDescriptor_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
  (this->m_Desc).m_TargetFrameSubDescriptorList.
  super__List_base<ASDCP::MXF::TargetFrameSubDescriptor_*,_std::allocator<ASDCP::MXF::TargetFrameSubDescriptor_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar2;
  (this->m_Desc).m_TargetFrameSubDescriptorList.
  super__List_base<ASDCP::MXF::TargetFrameSubDescriptor_*,_std::allocator<ASDCP::MXF::TargetFrameSubDescriptor_*>_>
  ._M_impl._M_node._M_size = 0;
  ASDCP::WriterInfo::WriterInfo(&this->m_WriterInfo);
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_HasValue = false;
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[0] = '\0';
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[1] = '\0';
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[2] = '\0';
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[3] = '\0';
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[4] = '\0';
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[5] = '\0';
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar3 = &this->m_PictureEssenceCoding;
  (pUVar3->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[0xf] = '\0';
  this->m_MaxBitrate = 0.0;
  this->m_AvgBitrate = 0.0;
  (this->m_PictureEssenceCoding).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00113ae8;
  return;
}

Assistant:

FileInfoWrapper(const IFileReaderFactory& fileReaderFactory) : m_MaxBitrate(0.0), m_AvgBitrate(0.0), m_Reader(fileReaderFactory) {}